

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall
persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
::compute_higher_persistence
          (persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  ulong uVar1;
  iterator *piVar2;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *pvVar3;
  pair<float,_int> *ppVar4;
  int iVar5;
  ulong uVar6;
  pair<int,_int> pVar7;
  ostream *poVar8;
  long lVar9;
  undefined6 in_register_00000012;
  int iVar10;
  long lVar11;
  int dimension;
  int iVar12;
  long lVar13;
  long *plVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  value_t vVar19;
  undefined1 auVar20 [16];
  double dVar21;
  pivot_column_index_t pivot_column_index;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  if ((int)CONCAT62(in_register_00000012,max_dimension) != 0) {
    uVar17 = (ulong)min_dimension;
    uVar16 = 1;
    do {
      dimension = (int)uVar16;
      vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
      prepare_next_dimension(this->complex,dimension);
      uVar1 = uVar16 + 1;
      if ((uVar1 == uVar17) &&
         (lVar15 = (long)*(int *)(*(long *)&(this->complex->binomial_coeff).B.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [(int)this->complex->n].
                                            super__Vector_base<int,_std::allocator<int>_> + 4 +
                                 uVar16 * 4), 0 < lVar15)) {
        lVar11 = 0;
        lVar13 = 0;
        do {
          pvVar3 = this->complex;
          lVar9 = 0x18;
          if ((uVar16 != (uint)pvVar3->current_dimension) &&
             (lVar9 = 0x20, uVar16 != pvVar3->current_dimension + 1)) {
            poVar8 = std::operator<<((ostream *)&std::cerr,
                                     "Called filtration(dim, index) with wrong dimension: ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,dimension);
            poVar8 = std::operator<<(poVar8," (current dimension is ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar3->current_dimension);
            poVar8 = std::operator<<(poVar8,").");
            std::endl<char,std::char_traits<char>>(poVar8);
            exit(-1);
          }
          vVar19 = rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                   ::filtration(*(rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                                  **)((long)&pvVar3->distance_matrix + lVar9),(index_t)lVar13);
          local_68._0_8_ = (ulong)(uint)vVar19 + lVar11;
          ppVar4 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar4 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_push_back_aux<filtration_index_t>
                      (&this->columns_to_reduce,(filtration_index_t *)local_68);
          }
          else {
            *ppVar4 = (pair<float,_int>)local_68._0_8_;
            piVar2 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar2->_M_cur = piVar2->_M_cur + 1;
          }
          lVar13 = lVar13 + 1;
          lVar11 = lVar11 + 0x100000000;
        } while (lVar15 != lVar13);
      }
      if (uVar17 <= uVar1) {
        (*this->output->_vptr_output_t[5])(this->output,uVar16 & 0xffff);
        sort_columns(this);
        local_68._0_8_ = (long)local_40 + 8;
        local_68._8_8_ = 1;
        local_68._16_16_ = (undefined1  [16])0x0;
        local_48 = 1.0;
        local_40 = (undefined1  [16])0x0;
        iVar10 = *(int *)(*(long *)&(this->complex->binomial_coeff).B.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)this->complex->n]
                                    .super__Vector_base<int,_std::allocator<int>_> + 4 + uVar1 * 4);
        auVar20._8_4_ = iVar10 >> 0x1f;
        auVar20._0_8_ = (long)iVar10;
        auVar20._12_4_ = 0x45300000;
        dVar21 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0);
        uVar6 = (ulong)dVar21;
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::rehash((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_68,(long)(dVar21 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
        pVar7 = compute_pairs(this,dimension,(pivot_column_index_t *)local_68,uVar17 <= uVar16);
        iVar10 = pVar7.second;
        if (uVar16 < uVar17) {
          if (((uVar16 == min_dimension - 1) && (this->print_betti_numbers_to_console == true)) &&
             (this->max_entries != 0xffffffffffffffff)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Skipped columns in dimension ",0x1f);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            plVar14 = (long *)std::ostream::operator<<(poVar8,iVar10);
            std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
            goto LAB_0011e0f7;
          }
        }
        else {
          iVar12 = pVar7.first;
          (*this->output->_vptr_output_t[9])(this->output,(long)iVar12,(long)pVar7 >> 0x20);
          iVar5 = -iVar12;
          if ((uVar16 & 1) == 0) {
            iVar5 = iVar12;
          }
          this->euler_characteristic = this->euler_characteristic + iVar5;
          if (this->print_betti_numbers_to_console == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dim H_",6);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
            std::ostream::operator<<(poVar8,iVar12);
            if (iVar10 != 0 && -1 < (long)pVar7) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," (skipped ",10);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            plVar14 = &std::cout;
LAB_0011e0f7:
            std::ostream::put((char)plVar14);
            std::ostream::flush();
          }
        }
        if (uVar16 < max_dimension) {
          assemble_columns_to_reduce(this,dimension,(pivot_column_index_t *)local_68);
        }
        if ((int)(uint)this->complex->max_dimension <= this->complex->current_dimension) {
          (*this->output->_vptr_output_t[10])();
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_68);
          return;
        }
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_68);
      }
      bVar18 = uVar16 != max_dimension;
      uVar16 = uVar1;
    } while (bVar18);
  }
  return;
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}